

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall cmCustomCommand::cmCustomCommand(cmCustomCommand *this)

{
  cmCustomCommand *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  ImplicitDependsList::ImplicitDependsList(&this->ImplicitDepends);
  std::__cxx11::string::string((string *)&this->Comment);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  std::__cxx11::string::string((string *)&this->Depfile);
  this->HaveComment = false;
  this->EscapeOldStyle = true;
  this->EscapeAllowMakeVars = false;
  this->UsesTerminal = false;
  this->CommandExpandLists = false;
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand()
  : Backtrace()
{
  this->HaveComment = false;
  this->EscapeOldStyle = true;
  this->EscapeAllowMakeVars = false;
  this->UsesTerminal = false;
  this->CommandExpandLists = false;
}